

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# authority_suite.cpp
# Opt level: O1

void __thiscall
reader_authority_suite::test_ipv4_increasing::test_method(test_ipv4_increasing *this)

{
  int iVar1;
  char *local_140;
  view_type *local_138;
  undefined1 local_130 [8];
  undefined8 local_128;
  shared_count sStack_120;
  char local_118 [4];
  view_type local_114;
  undefined8 *local_100;
  char *local_f8;
  undefined **local_f0;
  undefined1 local_e8;
  undefined8 *local_e0;
  char **local_d8;
  undefined **local_d0;
  undefined1 local_c8;
  undefined8 *local_c0;
  view_type **local_b8;
  char input [8];
  char *local_a8;
  char *local_a0;
  basic_authority<char> local_98;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  builtin_strncpy(input,"0.1.2.3",8);
  local_98.super_base<char,_trial::url::reader::basic_authority>.input.len_ = strlen(input);
  local_98.super_base<char,_trial::url::reader::basic_authority>.current_token = end;
  local_98.super_base<char,_trial::url::reader::basic_authority>.input.ptr_ = input;
  local_98.super_base<char,_trial::url::reader::basic_authority>.current_view.ptr_ = input;
  local_98.super_base<char,_trial::url::reader::basic_authority>.current_view.len_ =
       local_98.super_base<char,_trial::url::reader::basic_authority>.input.len_;
  trial::url::reader::basic_authority<char>::do_next(&local_98);
  local_40 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x53);
  local_114.len_._4_1_ = 0;
  local_114._4_8_ = &PTR__lazy_ostream_00186260;
  local_100 = &boost::unit_test::lazy_ostream::inst;
  local_f8 = "";
  local_138 = &local_114;
  local_114.ptr_._0_4_ =
       local_98.super_base<char,_trial::url::reader::basic_authority>.current_token;
  local_140 = local_118;
  local_118[0] = '\x05';
  local_118[1] = '\0';
  local_118[2] = '\0';
  local_118[3] = '\0';
  local_130[0] = local_98.super_base<char,_trial::url::reader::basic_authority>.current_token ==
                 authority_host_ipv4;
  local_128 = 0;
  sStack_120.pi_ = (sp_counted_base *)0x0;
  local_a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_a0 = "";
  local_b8 = &local_138;
  local_c8 = 0;
  local_d0 = &PTR__lazy_ostream_00186618;
  local_c0 = &boost::unit_test::lazy_ostream::inst;
  local_d8 = &local_140;
  local_e8 = 0;
  local_f0 = &PTR__lazy_ostream_00186618;
  local_e0 = &boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_120);
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_58 = "";
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_60,0x54);
  local_114.len_._4_1_ = 0;
  local_114._4_8_ = &PTR__lazy_ostream_00186260;
  local_100 = &boost::unit_test::lazy_ostream::inst;
  local_f8 = "";
  if (local_98.super_base<char,_trial::url::reader::basic_authority>.current_view.len_ == 7) {
    iVar1 = bcmp(local_98.super_base<char,_trial::url::reader::basic_authority>.current_view.ptr_,
                 "0.1.2.3",7);
    local_130[0] = iVar1 == 0;
  }
  else {
    local_130[0] = false;
  }
  local_128 = 0;
  sStack_120.pi_ = (sp_counted_base *)0x0;
  local_a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_a0 = "";
  local_c8 = 0;
  local_d0 = &PTR__lazy_ostream_00186598;
  local_c0 = &boost::unit_test::lazy_ostream::inst;
  local_b8 = &local_138;
  local_140 = "0.1.2.3";
  local_e8 = 0;
  local_f0 = &PTR__lazy_ostream_00186398;
  local_e0 = &boost::unit_test::lazy_ostream::inst;
  local_d8 = &local_140;
  local_138 = &local_98.super_base<char,_trial::url::reader::basic_authority>.current_view;
  boost::test_tools::tt_detail::report_assertion
            (local_130,(undefined1 *)((long)&local_114.ptr_ + 4),&local_a8,0x54,2,2,2,
             "reader.literal()",&local_d0,"\"0.1.2.3\"",&local_f0);
  boost::detail::shared_count::~shared_count(&sStack_120);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_ipv4_increasing)
{
    const char input[] = "0.1.2.3";
    url::reader::authority reader(input);
    BOOST_REQUIRE_EQUAL(reader.subcode(), url::token::subcode::authority_host_ipv4);
    BOOST_REQUIRE_EQUAL(reader.literal(), "0.1.2.3");
}